

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_moria(chunk_conflict *c,loc centre,wchar_t rating)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t y1_00;
  wchar_t x1_00;
  wchar_t y2_00;
  wchar_t x2_00;
  uint32_t uVar5;
  uint32_t uVar6;
  wchar_t local_40;
  wchar_t wStack_3c;
  _Bool light;
  wchar_t width;
  wchar_t height;
  wchar_t i;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  iVar1 = c->depth;
  unique0x100004c3 = centre;
  uVar3 = Rand_div(0x23);
  uVar4 = Rand_div(5);
  wStack_3c = uVar4 + L'\b';
  uVar4 = Rand_div(5);
  local_40 = uVar4 + L'\n';
  width = L'\0';
  do {
    if (L'\x01' < width) {
LAB_00170ec8:
      y1_00 = iStack_10 - wStack_3c / 2;
      x1_00 = c_local._4_4_ - local_40 / 2;
      y2_00 = y1_00 + wStack_3c + L'\xffffffff';
      x2_00 = x1_00 + local_40 + L'\xffffffff';
      _Var2 = generate_starburst_room
                        (c,y1_00,x1_00,y2_00,x2_00,iVar1 <= (int)(uVar3 + 1),FEAT_FLOOR,true);
      if (_Var2) {
        uVar3 = Rand_div(0x14);
        if (uVar3 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"rubble");
          uVar3 = Rand_div(wStack_3c / 4);
          uVar4 = Rand_div(local_40 / 4);
          uVar5 = Rand_div(wStack_3c / 4);
          uVar6 = Rand_div(local_40 / 4);
          generate_starburst_room
                    (c,y1_00 + uVar3,x1_00 + uVar4,y2_00 - uVar5,x2_00 - uVar6,false,
                     FEAT_PASS_RUBBLE,false);
        }
        else {
          uVar3 = Rand_div(0x32);
          if (uVar3 == 0) {
            event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"trees");
            uVar3 = Rand_div(wStack_3c / 4);
            uVar4 = Rand_div(local_40 / 4);
            uVar5 = Rand_div(wStack_3c / 4);
            uVar6 = Rand_div(local_40 / 4);
            generate_starburst_room
                      (c,y1_00 + uVar3,x1_00 + uVar4,y2_00 - uVar5,x2_00 - uVar6,false,FEAT_TREE,
                       false);
          }
          else {
            uVar3 = Rand_div(0x32);
            if (uVar3 == 0) {
              event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"trees");
              uVar3 = Rand_div(wStack_3c / 4);
              uVar4 = Rand_div(local_40 / 4);
              uVar5 = Rand_div(wStack_3c / 4);
              uVar6 = Rand_div(local_40 / 4);
              generate_starburst_room
                        (c,y1_00 + uVar3,x1_00 + uVar4,y2_00 - uVar5,x2_00 - uVar6,false,FEAT_TREE2,
                         false);
            }
            else {
              uVar3 = Rand_div(10);
              if (uVar3 == 0) {
                event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"water");
                uVar3 = Rand_div(wStack_3c / 4);
                uVar4 = Rand_div(local_40 / 4);
                uVar5 = Rand_div(wStack_3c / 4);
                uVar6 = Rand_div(local_40 / 4);
                generate_starburst_room
                          (c,y1_00 + uVar3,x1_00 + uVar4,y2_00 - uVar5,x2_00 - uVar6,false,
                           FEAT_WATER,false);
              }
            }
          }
        }
        centre_local.x._3_1_ = true;
      }
      else {
        centre_local.x._3_1_ = false;
      }
      return centre_local.x._3_1_;
    }
    if ((width == L'\0') && (uVar4 = Rand_div(0xf), uVar4 == 0)) {
      uVar4 = Rand_div(2);
      wStack_3c = (uVar4 + 2) * wStack_3c;
      uVar4 = Rand_div(3);
      local_40 = (uVar4 + 3) * local_40;
    }
    else {
      uVar4 = Rand_div(4);
      if (uVar4 != 0) {
        uVar4 = Rand_div(0xf);
        if (uVar4 == 0) {
          uVar4 = Rand_div(2);
          wStack_3c = (uVar4 + 2) * wStack_3c;
        }
        else {
          uVar4 = Rand_div(3);
          local_40 = (uVar4 + 2) * local_40;
        }
      }
    }
    if ((iStack_10 < c->height) && (c_local._4_4_ < c->width)) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wStack_3c,local_40);
      goto LAB_00170ec8;
    }
    _Var2 = find_space((loc *)((long)&c_local + 4),wStack_3c,local_40);
    if (_Var2) {
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wStack_3c,local_40);
      goto LAB_00170ec8;
    }
    if ((width != L'\0') &&
       (event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wStack_3c,local_40), width == L'\x01')) {
      return false;
    }
    width = width + L'\x01';
  } while( true );
}

Assistant:

bool build_moria(struct chunk *c, struct loc centre, int rating)
{
	int y1, x1, y2, x2;
	int i;
	int height, width;

	bool light = c->depth <= randint1(35);

	/* Pick a room size */
	height = 8 + randint0(5);
	width = 10 + randint0(5);


	/* Try twice to find space for a room. */
	for (i = 0; i < 2; i++) {
		/* Really large room - only on first try. */
		if ((i == 0) && one_in_(15)) {
			height *= 1 + randint1(2);
			width *= 2 + randint1(3);
		}

		/* Long, narrow room.  Sometimes tall and thin. */
		else if (!one_in_(4)) {
			if (one_in_(15))
				height *= 2 + randint0(2);
			else
				width *= 2 + randint0(3);
		}

		/* Find and reserve some space in the dungeon.  Get center of room. */
		if ((centre.y >= c->height) || (centre.x >= c->width)) {
			if (!find_space(&centre, height, width)) {
				if (i == 0) continue;  /* Failed first attempt */
				event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
					height, width);
				if (i == 1) return (false);  /* Failed second attempt */
			} else {
				event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
					height, width);
				break;  /* Success */
			}
		} else {
			event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
				height, width);
			break;   /* Not finding space */
		}
	}

	/* Locate the room */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;


	/* Generate starburst room.  Return immediately if out of bounds. */
	if (!generate_starburst_room(c, y1, x1, y2, x2, light, FEAT_FLOOR, true)) {
		return (false);
	}

	/* Sometimes, the room may have rubble, trees or water in it. */
	if (one_in_(20)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "rubble");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_PASS_RUBBLE, false);
	} else if (one_in_(50)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "trees");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_TREE, false);
	} else if (one_in_(50)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "trees");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_TREE2, false);
	} else if (one_in_(10)) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "water");
		(void) generate_starburst_room(c, y1 + randint0(height / 4),
									   x1 + randint0(width / 4),
									   y2 - randint0(height / 4),
									   x2 - randint0(width / 4), false,
									   FEAT_WATER, false);
	}

	/* Success */
	return (true);
}